

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceMatrixDecomposition::distributeIntermediateData(ForceMatrixDecomposition *this)

{
  return;
}

Assistant:

void ForceMatrixDecomposition::distributeIntermediateData() {
#ifdef IS_MPI
    snap_              = sman_->getCurrentSnapshot();
    atomStorageLayout_ = sman_->getAtomStorageLayout();

    if (atomStorageLayout_ & DataStorage::dslFunctional) {
      AtomPlanRealRow->gather(snap_->atomData.functional,
                              atomRowData.functional);
      AtomPlanRealColumn->gather(snap_->atomData.functional,
                                 atomColData.functional);
    }

    if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
      AtomPlanRealRow->gather(snap_->atomData.functionalDerivative,
                              atomRowData.functionalDerivative);
      AtomPlanRealColumn->gather(snap_->atomData.functionalDerivative,
                                 atomColData.functionalDerivative);
    }
#endif
  }